

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O1

void __thiscall wasm::Flatten::visitFunction(Flatten *this,Function *curr)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar2 = curr->body;
  if (1 < (pEVar2->type).id) {
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       (&((this->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          .
                          super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          .
                          super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .currModule)->allocator,0x18,8);
    pEVar1->_id = ReturnId;
    (pEVar1->type).id = 0;
    *(undefined8 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 1;
    *(Expression **)(pEVar1 + 1) = pEVar2;
    curr->body = pEVar1;
  }
  pEVar2 = getPreludesWithExpression(this,pEVar2,curr->body);
  curr->body = pEVar2;
  EHUtils::handleBlockNestedPops
            (curr,(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                  ).
                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .
                  super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .currModule,SkipIfNoEH);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* originalBody = curr->body;
    // if the body is a block with a result, turn that into a return
    if (curr->body->type.isConcrete()) {
      curr->body = Builder(*getModule()).makeReturn(curr->body);
    }
    // the body may have preludes
    curr->body = getPreludesWithExpression(originalBody, curr->body);

    // Flatten can generate blocks within 'catch', making pops invalid. Fix them
    // up.
    EHUtils::handleBlockNestedPops(curr, *getModule());
  }